

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QDataStream * operator>>(QDataStream *ds,QLocale *l)

{
  QSharedDataPointer<QLocalePrivate> QVar1;
  long in_FS_OFFSET;
  QLocale local_40;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  local_38.size = 0;
  operator>>(ds,(QString *)&local_38);
  QLocale::QLocale(&local_40,(QString *)&local_38);
  QVar1.d.ptr = (totally_ordered_wrapper<QLocalePrivate_*>)(l->d).d.ptr;
  (l->d).d.ptr = (QLocalePrivate *)local_40;
  local_40.d.d.ptr =
       (QSharedDataPointer<QLocalePrivate>)(QSharedDataPointer<QLocalePrivate>)QVar1.d.ptr;
  QLocale::~QLocale(&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return ds;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &ds, QLocale &l)
{
    QString s;
    ds >> s;
    l = QLocale(s);
    return ds;
}